

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkDirectoriesCommand.h
# Opt level: O0

cmCommand * __thiscall cmTargetLinkDirectoriesCommand::Clone(cmTargetLinkDirectoriesCommand *this)

{
  cmCommand *this_00;
  cmTargetLinkDirectoriesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetLinkDirectoriesCommand((cmTargetLinkDirectoriesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmTargetLinkDirectoriesCommand; }